

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O3

void cmQtAutoGen::RccListParseContent
               (string *content,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  long lVar1;
  bool bVar2;
  pointer string;
  string tag;
  string qrcEntry;
  RegularExpression fileReplaceRegex;
  RegularExpression fileMatchRegex;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228;
  undefined7 uStack_227;
  char *local_218;
  long local_210;
  char local_208;
  undefined7 uStack_207;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  local_1f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files;
  cmsys::RegularExpression::compile(&local_100,"(<file[^<]+)");
  local_1d0.regmatch.startp[0] = (char *)0x0;
  local_1d0.regmatch.endp[0] = (char *)0x0;
  local_1d0.regmatch.searchstring = (char *)0x0;
  local_1d0.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_1d0,"(^<file[^>]*>)");
  string = (content->_M_dataplus)._M_p;
  while( true ) {
    bVar2 = cmsys::RegularExpression::find(&local_100,string,&local_100.regmatch);
    if (!bVar2) break;
    local_218 = &local_208;
    if (local_100.regmatch.startp[1] == (char *)0x0) {
      local_210 = 0;
      local_208 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,local_100.regmatch.startp[1],local_100.regmatch.endp[1]);
    }
    lVar1 = local_210;
    cmsys::RegularExpression::find(&local_1d0,local_218,&local_1d0.regmatch);
    if (local_1d0.regmatch.startp[1] == (char *)0x0) {
      local_238 = &local_228;
      local_230 = 0;
      local_228 = 0;
    }
    else {
      local_238 = &local_228;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,local_1d0.regmatch.startp[1],local_1d0.regmatch.endp[1]);
    }
    std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&local_218);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_1f8,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
    }
    string = string + lVar1;
  }
  if (local_1d0.program != (char *)0x0) {
    operator_delete__(local_1d0.program);
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return;
}

Assistant:

void cmQtAutoGen::RccListParseContent(std::string const& content,
                                      std::vector<std::string>& files)
{
  cmsys::RegularExpression fileMatchRegex("(<file[^<]+)");
  cmsys::RegularExpression fileReplaceRegex("(^<file[^>]*>)");

  const char* contentChars = content.c_str();
  while (fileMatchRegex.find(contentChars)) {
    std::string const qrcEntry = fileMatchRegex.match(1);
    contentChars += qrcEntry.size();
    {
      fileReplaceRegex.find(qrcEntry);
      std::string const tag = fileReplaceRegex.match(1);
      files.push_back(qrcEntry.substr(tag.size()));
    }
  }
}